

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

OnCallSpec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()> *
__thiscall
testing::internal::
FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
FindOnCallSpec(FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *this,ArgumentTuple *args)

{
  OnCallSpec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *this_00;
  bool bVar1;
  reference ppvVar2;
  OnCallSpec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *spec;
  const_reverse_iterator it;
  ArgumentTuple *args_local;
  FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *this_local;
  
  it.current._M_current =
       (__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
        )(__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
          )args;
  std::vector<const_void_*,_std::allocator<const_void_*>_>::rbegin
            ((vector<const_void_*,_std::allocator<const_void_*>_> *)&stack0xffffffffffffffd8);
  while( true ) {
    std::vector<const_void_*,_std::allocator<const_void_*>_>::rend
              ((vector<const_void_*,_std::allocator<const_void_*>_> *)&spec);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                             *)&stack0xffffffffffffffd8,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                             *)&spec);
    if (!bVar1) {
      return (OnCallSpec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)0x0;
    }
    ppvVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                           *)&stack0xffffffffffffffd8);
    this_00 = (OnCallSpec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)*ppvVar2;
    bVar1 = OnCallSpec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            ::Matches(this_00,(ArgumentTuple *)it.current._M_current);
    if (bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                  *)&stack0xffffffffffffffd8);
  }
  return this_00;
}

Assistant:

const OnCallSpec<F>* FindOnCallSpec(
      const ArgumentTuple& args) const {
    for (UntypedOnCallSpecs::const_reverse_iterator it
             = untyped_on_call_specs_.rbegin();
         it != untyped_on_call_specs_.rend(); ++it) {
      const OnCallSpec<F>* spec = static_cast<const OnCallSpec<F>*>(*it);
      if (spec->Matches(args))
        return spec;
    }

    return nullptr;
  }